

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool array_array_container_inplace_union
                (array_container_t *src_1,array_container_t *src_2,container_t **dst)

{
  int iVar1;
  uint64_t *puVar2;
  uint16_t *puVar3;
  long lVar4;
  int32_t min;
  array_container_t *out;
  bitset_container_t *pbVar5;
  uint64_t uVar6;
  size_t sVar7;
  ushort uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  uint16_t *puVar12;
  bitset_container_t *ourbitset;
  
  iVar9 = src_1->cardinality;
  iVar1 = src_2->cardinality;
  iVar10 = iVar1 + iVar9;
  *dst = (container_t *)0x0;
  if (iVar10 < 0x1001) {
    if (src_1->capacity < iVar10) {
      out = array_container_create_given_capacity(iVar10 * 2);
      *dst = out;
      if (out == (array_container_t *)0x0) {
        return true;
      }
      array_container_union(src_1,src_2,out);
    }
    else {
      memmove(src_1->array + iVar1,src_1->array,(long)iVar9 * 2);
      sVar7 = union_uint16(src_1->array + src_2->cardinality,(long)src_1->cardinality,src_2->array,
                           (long)src_2->cardinality,src_1->array);
      src_1->cardinality = (int32_t)sVar7;
    }
  }
  else {
    pbVar5 = bitset_container_create();
    *dst = pbVar5;
    if (pbVar5 == (bitset_container_t *)0x0) {
      return true;
    }
    bitset_set_list(pbVar5->words,src_1->array,(long)src_1->cardinality);
    uVar6 = bitset_set_list_withcard
                      (pbVar5->words,(long)src_1->cardinality,src_2->array,(long)src_2->cardinality)
    ;
    min = (int32_t)uVar6;
    pbVar5->cardinality = min;
    if (0x1000 < min) {
      return true;
    }
    if (src_1->capacity < min) {
      array_container_grow(src_1,min,false);
    }
    puVar2 = pbVar5->words;
    puVar3 = src_1->array;
    uVar8 = 0;
    iVar9 = 0;
    lVar11 = 0;
    do {
      uVar6 = puVar2[lVar11];
      if (uVar6 != 0) {
        puVar12 = puVar3 + iVar9;
        do {
          lVar4 = 0;
          if (uVar6 != 0) {
            for (; (uVar6 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
            }
          }
          *puVar12 = (ushort)lVar4 | uVar8;
          puVar12 = puVar12 + 1;
          iVar9 = iVar9 + 1;
          uVar6 = uVar6 & uVar6 - 1;
        } while (uVar6 != 0);
      }
      uVar8 = uVar8 + 0x40;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x400);
    src_1->cardinality = pbVar5->cardinality;
    *dst = src_1;
    if (pbVar5->words != (uint64_t *)0x0) {
      (*global_memory_hook.aligned_free)(pbVar5->words);
      pbVar5->words = (uint64_t *)0x0;
    }
    (*global_memory_hook.free)(pbVar5);
  }
  return false;
}

Assistant:

bool array_array_container_inplace_union(array_container_t *src_1,
                                         const array_container_t *src_2,
                                         container_t **dst) {
    int totalCardinality = src_1->cardinality + src_2->cardinality;
    *dst = NULL;
    if (totalCardinality <= DEFAULT_MAX_SIZE) {
        if (src_1->capacity < totalCardinality) {
            *dst = array_container_create_given_capacity(
                2 * totalCardinality);  // be purposefully generous
            if (*dst != NULL) {
                array_container_union(src_1, src_2, CAST_array(*dst));
            } else {
                return true;  // otherwise failure won't be caught
            }
            return false;  // not a bitset
        } else {
            memmove(src_1->array + src_2->cardinality, src_1->array,
                    src_1->cardinality * sizeof(uint16_t));
            // In theory, we could use fast_union_uint16, but it is unsafe. It
            // fails with Intel compilers in particular.
            // https://github.com/RoaringBitmap/CRoaring/pull/452
            // See report https://github.com/RoaringBitmap/CRoaring/issues/476
            src_1->cardinality = (int32_t)union_uint16(
                src_1->array + src_2->cardinality, src_1->cardinality,
                src_2->array, src_2->cardinality, src_1->array);
            return false;  // not a bitset
        }
    }
    *dst = bitset_container_create();
    bool returnval = true;  // expect a bitset
    if (*dst != NULL) {
        bitset_container_t *ourbitset = CAST_bitset(*dst);
        bitset_set_list(ourbitset->words, src_1->array, src_1->cardinality);
        ourbitset->cardinality = (int32_t)bitset_set_list_withcard(
            ourbitset->words, src_1->cardinality, src_2->array,
            src_2->cardinality);
        if (ourbitset->cardinality <= DEFAULT_MAX_SIZE) {
            // need to convert!
            if (src_1->capacity < ourbitset->cardinality) {
                array_container_grow(src_1, ourbitset->cardinality, false);
            }

            bitset_extract_setbits_uint16(ourbitset->words,
                                          BITSET_CONTAINER_SIZE_IN_WORDS,
                                          src_1->array, 0);
            src_1->cardinality = ourbitset->cardinality;
            *dst = src_1;
            bitset_container_free(ourbitset);
            returnval = false;  // not going to be a bitset
        }
    }
    return returnval;
}